

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreeview.cpp
# Opt level: O3

void __thiscall QTreeView::collapse(QTreeView *this,QModelIndex *index)

{
  QTreeViewPrivate *this_00;
  QAbstractItemModel *pQVar1;
  Data<QHashPrivate::Node<QPersistentModelIndex,_QHashDummyValue>_> *this_01;
  Data<QHashPrivate::MultiNode<QtPrivate::QModelIndexWrapper,_QPersistentModelIndexData_*>_>
  *this_02;
  char cVar2;
  bool bVar3;
  int item;
  QAbstractItemModel *pQVar4;
  Node<QPersistentModelIndex,_QHashDummyValue> *pNVar5;
  QWidget *this_03;
  long in_FS_OFFSET;
  Bucket BVar6;
  QModelIndex local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((-1 < index->r) && (-1 < index->c)) {
    this_00 = *(QTreeViewPrivate **)
               &(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.super_QWidget
                .field_0x8;
    pQVar1 = (index->m).ptr;
    pQVar4 = (this_00->super_QAbstractItemViewPrivate).model;
    if (pQVar1 == pQVar4) {
      if (pQVar1 != (QAbstractItemModel *)0x0) {
        cVar2 = (**(code **)(*(long *)pQVar1 + 0x138))(pQVar1,index);
        if (cVar2 < '\0') goto LAB_0059daeb;
        pQVar4 = (this_00->super_QAbstractItemViewPrivate).model;
      }
      local_58.m.ptr = (index->m).ptr;
      local_58.r = index->r;
      local_58.c = index->c;
      local_58.i = index->i;
      if (*(Data<QHashPrivate::MultiNode<QtPrivate::QModelIndexWrapper,_QPersistentModelIndexData_*>_>
            **)(*(long *)(pQVar4 + 8) + 0x90) !=
          (Data<QHashPrivate::MultiNode<QtPrivate::QModelIndexWrapper,_QPersistentModelIndexData_*>_>
           *)0x0) {
        BVar6 = QHashPrivate::
                Data<QHashPrivate::MultiNode<QtPrivate::QModelIndexWrapper,_QPersistentModelIndexData_*>_>
                ::findBucket<QtPrivate::QModelIndexWrapper>
                          (*(Data<QHashPrivate::MultiNode<QtPrivate::QModelIndexWrapper,_QPersistentModelIndexData_*>_>
                             **)(*(long *)(pQVar4 + 8) + 0x90),(QModelIndexWrapper *)&local_58);
        if ((BVar6.span[BVar6.index] != (Span)0xff) && (*(long *)(BVar6.span + 0x80) != 0)) {
          QPersistentModelIndex::QPersistentModelIndex((QPersistentModelIndex *)&local_58,index);
          this_01 = (this_00->expandedIndexes).q_hash.d;
          if (this_01 == (Data<QHashPrivate::Node<QPersistentModelIndex,_QHashDummyValue>_> *)0x0) {
            QPersistentModelIndex::~QPersistentModelIndex((QPersistentModelIndex *)&local_58);
          }
          else {
            pNVar5 = QHashPrivate::Data<QHashPrivate::Node<QPersistentModelIndex,_QHashDummyValue>_>
                     ::findNode<QPersistentModelIndex>(this_01,(QPersistentModelIndex *)&local_58);
            QPersistentModelIndex::~QPersistentModelIndex((QPersistentModelIndex *)&local_58);
            if (pNVar5 != (Node<QPersistentModelIndex,_QHashDummyValue> *)0x0) {
              QBasicTimer::stop();
              if ((this_00->super_QAbstractItemViewPrivate).delayedPendingLayout != true) {
                item = QTreeViewPrivate::viewIndex(this_00,index);
                if (item != -1) {
                  QTreeViewPrivate::collapse(this_00,item,true);
                  if ((this_00->super_QAbstractItemViewPrivate).state != AnimatingState) {
                    (**(code **)(*(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea
                                           .super_QFrame.super_QWidget + 0x268))(this);
                    this_03 = QAbstractScrollArea::viewport((QAbstractScrollArea *)this);
                    QWidget::update(this_03);
                  }
                  goto LAB_0059daeb;
                }
              }
              local_58.m.ptr = (index->m).ptr;
              local_58.r = index->r;
              local_58.c = index->c;
              local_58.i = index->i;
              this_02 = *(Data<QHashPrivate::MultiNode<QtPrivate::QModelIndexWrapper,_QPersistentModelIndexData_*>_>
                          **)(*(long *)((this_00->super_QAbstractItemViewPrivate).model + 8) + 0x90)
              ;
              if (this_02 !=
                  (Data<QHashPrivate::MultiNode<QtPrivate::QModelIndexWrapper,_QPersistentModelIndexData_*>_>
                   *)0x0) {
                BVar6 = QHashPrivate::
                        Data<QHashPrivate::MultiNode<QtPrivate::QModelIndexWrapper,_QPersistentModelIndexData_*>_>
                        ::findBucket<QtPrivate::QModelIndexWrapper>
                                  (this_02,(QModelIndexWrapper *)&local_58);
                if ((BVar6.span[BVar6.index] != (Span)0xff) && (*(long *)(BVar6.span + 0x80) != 0))
                {
                  QPersistentModelIndex::QPersistentModelIndex
                            ((QPersistentModelIndex *)&local_58,index);
                  bVar3 = QHash<QPersistentModelIndex,_QHashDummyValue>::
                          removeImpl<QPersistentModelIndex>
                                    (&(this_00->expandedIndexes).q_hash,
                                     (QPersistentModelIndex *)&local_58);
                  QPersistentModelIndex::~QPersistentModelIndex((QPersistentModelIndex *)&local_58);
                  if (bVar3) {
                    local_58.r = 0;
                    local_58.c = 0;
                    local_58.i = (quintptr)index;
                    QMetaObject::activate((QObject *)this,&staticMetaObject,1,(void **)&local_58);
                  }
                }
              }
            }
          }
        }
      }
    }
  }
LAB_0059daeb:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTreeView::collapse(const QModelIndex &index)
{
    Q_D(QTreeView);
    if (!d->isIndexValid(index))
        return;
    if (!d->isIndexExpanded(index))
        return;
    //if the current item is now invisible, the autoscroll will expand the tree to see it, so disable the autoscroll
    d->delayedAutoScroll.stop();

    if (d->delayedPendingLayout) {
        //A complete relayout is going to be performed, just un-store the expanded index, no need to layout.
        if (d->isPersistent(index) && d->expandedIndexes.remove(index))
            emit collapsed(index);
        return;
    }
    int i = d->viewIndex(index);
    if (i != -1) { // is visible
        d->collapse(i, true);
        if (!d->isAnimating()) {
            updateGeometries();
            viewport()->update();
        }
    } else {
        if (d->isPersistent(index) && d->expandedIndexes.remove(index))
            emit collapsed(index);
    }
}